

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  socklen_t __len;
  sockaddr *__addr;
  char *pcVar5;
  double dVar6;
  db students;
  string current_student;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  db local_670;
  char *local_628;
  long local_620;
  char local_618;
  undefined7 uStack_617;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  long local_508;
  int local_4fc [3];
  long *local_4f0 [2];
  long local_4e0 [2];
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lan::db::db(&local_670);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"List","");
  lan::db::declare(&local_670,&local_50,Array);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Carlos","");
  lan::db::declare(&local_670,&local_70,Array);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Anna","");
  lan::db::declare(&local_670,&local_90,Array);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Antony","");
  lan::db::declare(&local_670,&local_b0,Array);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"List","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Carlos","");
  lan::db::iterate<std::__cxx11::string>(&local_670,&local_d0,&local_f0,String);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"List","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Anna","");
  lan::db::iterate<std::__cxx11::string>(&local_670,&local_110,&local_130,String);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"List","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Antony","");
  lan::db::iterate<std::__cxx11::string>(&local_670,&local_150,&local_170,String);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Carlos","");
  lan::db::iterate<int>(&local_670,&local_190,0,Container);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Anna","");
  lan::db::iterate<int>(&local_670,&local_1b0,0,Container);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Antony","");
  lan::db::iterate<int>(&local_670,&local_1d0,0,Container);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Carlos","");
  lan::db::set_anchor(&local_670,&local_1f0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"@","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Full_name","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Carlos Eduard","");
  lan::db::set<std::__cxx11::string>(&local_670,&local_210,&local_230,&local_250,String,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"@","");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Average","");
  lan::db::set<double>(&local_670,&local_270,&local_290,13.0,Double,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"@","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Passed","");
  lan::db::set<bool>(&local_670,&local_2b0,&local_2d0,true,Bool,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"Anna","");
  lan::db::set_anchor(&local_670,&local_2f0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"@","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Full_name","");
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Anna Cristin","");
  lan::db::set<std::__cxx11::string>(&local_670,&local_310,&local_330,&local_350,String,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"@","");
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"Average","");
  lan::db::set<double>(&local_670,&local_370,&local_390,16.0,Double,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"@","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Passed","");
  lan::db::set<bool>(&local_670,&local_3b0,&local_3d0,true,Bool,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Antony","");
  lan::db::set_anchor(&local_670,&local_3f0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"@","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Full_name","");
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Antony Jeff","");
  lan::db::set<std::__cxx11::string>(&local_670,&local_410,&local_430,&local_450,String,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"@","");
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"Average","");
  lan::db::set<double>(&local_670,&local_470,&local_490,9.0,Double,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"@","");
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"Passed","");
  __len = 0;
  lan::db::set<bool>(&local_670,&local_4b0,&local_4d0,false,Bool,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"generated_example.ldb","");
  lan::db::connect(&local_670,(int)local_4f0,__addr,__len);
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0],local_4e0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Landia::db version: ",0x14);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,lan::db_version_abi_cxx11_,DAT_00114238);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"; Hello world!\n",0xf);
  local_628 = &local_618;
  local_620 = 0;
  local_618 = '\0';
  local_4fc[0] = 0;
  local_4fc[1] = 1;
  local_4fc[2] = 2;
  lVar4 = 0;
  do {
    iVar1 = *(int *)((long)local_4fc + lVar4);
    local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
    local_508 = lVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"List","");
    lan::db::get<std::__cxx11::string>(&local_690,&local_670,&local_528,(long)iVar1,String);
    std::__cxx11::string::operator=((string *)&local_628,(string *)&local_690);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
    }
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_5a8,local_628,local_628 + local_620);
    lan::db::set_anchor(&local_670,&local_5a8,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"info: Printing description for student <",0x28);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_628,local_620);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1 + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\tName: ",8);
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"@","");
    local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"Full_name","");
    lan::db::get<std::__cxx11::string>(&local_690,&local_670,&local_5c8,&local_548,String);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_690._M_dataplus._M_p,local_690._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tAverage : ",0xb);
    local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"@","");
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"Average","");
    dVar6 = lan::db::get<double>(&local_670,&local_5e8,&local_568,Double);
    poVar3 = std::ostream::_M_insert<double>(dVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tPassed : ",10);
    local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"@","");
    local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"Passed","");
    bVar2 = lan::db::get<bool>(&local_670,&local_608,&local_588,Bool);
    pcVar5 = "No";
    if (bVar2) {
      pcVar5 = "Yes";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,(ulong)bVar2 | 2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
      operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != &local_548.field_2) {
      operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
    lVar4 = local_508 + 4;
  } while (lVar4 != 0xc);
  lan::db::push(&local_670);
  if (local_628 != &local_618) {
    operator_delete(local_628,CONCAT71(uStack_617,local_618) + 1);
  }
  lan::db::~db(&local_670);
  return 0;
}

Assistant:

int main (int argc, const char * argv []) {
    
    lan::db students;
    
    students.declare("List", lan::Array);
    students.declare("Carlos", lan::Array);
    students.declare("Anna", lan::Array);
    students.declare("Antony", lan::Array);
    
    students.iterate<std::string>("List", "Carlos", lan::String);
    students.iterate<std::string>("List", "Anna", lan::String);
    students.iterate<std::string>("List", "Antony", lan::String);
    
    students.iterate("Carlos", 0, lan::Container);
    students.iterate("Anna", 0, lan::Container);
    students.iterate("Antony", 0, lan::Container);
    
    students.set_anchor("Carlos", 0);
    
    students.set<std::string>("@", "Full_name", "Carlos Eduard" ,lan::String, true);
    students.set<double>("@", "Average", 13 ,lan::Double, true);
    students.set<bool>("@", "Passed", true ,lan::Bool, true);
    
    students.set_anchor("Anna", 0);
    
    students.set<std::string>("@", "Full_name", "Anna Cristin" ,lan::String, true);
    students.set<double>("@", "Average", 16 ,lan::Double, true);
    students.set<bool>("@", "Passed", true ,lan::Bool, true);
    
    students.set_anchor("Antony", 0);
    
    students.set<std::string>("@", "Full_name", "Antony Jeff" ,lan::String, true);
    students.set<double>("@", "Average", 9 ,lan::Double, true);
    students.set<bool>("@", "Passed", false ,lan::Bool, true);
    
    students.connect("generated_example.ldb");
        
    // students.print();
    
    std::cout << "Landia::db version: " << lan::db_version << "; Hello world!\n";
    
    std::string current_student;
    
    for( auto i : { 0, 1, 2}){
                current_student = students.get<std::string>("List", i, lan::String);
                students.set_anchor(current_student, 0);
                std::cout << "info: Printing description for student <" << current_student << ">"
                << std::endl
                << i + 1 <<".\tName: " << students.get<std::string>("@", "Full_name", lan::String) 
                << std::endl
                << "\tAverage : " <<  students.get<double>("@", "Average", lan::Double)
                << std::endl
                << "\tPassed : " <<  ((students.get<bool>("@", "Passed", lan::Bool) ? "Yes" : "No"))
                << std::endl;
        }
    
    students.push();
    
}